

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918.cpp
# Opt level: O0

ssize_t __thiscall
TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
          (TMS9918<(TI::TMS::Personality)0> *this,int __fd,void *__buf,size_t __n)

{
  uint8_t value;
  uint uVar1;
  ulong uVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  uint8_t value_local;
  int address_local;
  TMS9918<(TI::TMS::Personality)0> *this_local;
  
  value = (uint8_t)__buf;
  uVar1 = Base<(TI::TMS::Personality)0>::masked_address
                    (&this->super_Base<(TI::TMS::Personality)0>,__fd);
  uVar2 = (ulong)(uVar1 - 3);
  if (uVar1 < 3 || uVar1 - 3 == 0) {
    switch((long)&switchD_00225381::switchdataD_009e3dfc +
           (long)(int)(&switchD_00225381::switchdataD_009e3dfc)[uVar1]) {
    case 0x225385:
      Base<(TI::TMS::Personality)0>::write_vram(&this->super_Base<(TI::TMS::Personality)0>,value);
      uVar2 = extraout_RAX;
      break;
    case 0x225394:
      Base<(TI::TMS::Personality)0>::write_register
                (&this->super_Base<(TI::TMS::Personality)0>,value);
      uVar2 = extraout_RAX_00;
      break;
    case 0x2253a3:
      Base<(TI::TMS::Personality)0>::write_palette(&this->super_Base<(TI::TMS::Personality)0>,value)
      ;
      uVar2 = extraout_RAX_01;
      break;
    case 0x2253b2:
      Base<(TI::TMS::Personality)0>::write_register_indirect
                (&this->super_Base<(TI::TMS::Personality)0>,value);
      uVar2 = extraout_RAX_02;
    }
  }
  return uVar2;
}

Assistant:

void TMS9918<personality>::write(int address, uint8_t value) {
	switch(this->masked_address(address)) {
		default: break;
		case 0:	this->write_vram(value);				break;
		case 1:	this->write_register(value);			break;
		case 2:	this->write_palette(value);				break;
		case 3: this->write_register_indirect(value);	break;
	}
}